

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsVisitor::update(ZConsVisitor *this)

{
  ZConsReader *pZVar1;
  _Rb_tree_node_base *p_Var2;
  iterator iVar3;
  pointer __k;
  RealType time;
  Vector3d com;
  Vector<double,_3U> local_30;
  
  Vector<double,_3U>::Vector(&local_30);
  for (p_Var2 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    *(undefined4 *)&p_Var2[1].field_0x4 = 1;
  }
  time = Snapshot::getTime(this->currSnapshot_);
  readZconsFile(this,time);
  pZVar1 = this->zconsReader_;
  for (__k = (pZVar1->fixedZmolData_).
             super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
             super__Vector_impl_data._M_start;
      __k != (pZVar1->fixedZmolData_).
             super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
             super__Vector_impl_data._M_finish; __k = __k + 1) {
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>,_std::_Select1st<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
            ::find(&(this->zmolStates_)._M_t,&__k->zmolIndex);
    *(undefined4 *)&iVar3._M_node[1].field_0x4 = 0;
  }
  return;
}

Assistant:

void ZConsVisitor::update() {
    Vector3d com;
    std::map<int, ZConsState>::iterator i;
    for (i = zmolStates_.begin(); i != zmolStates_.end(); ++i) {
      i->second = zsMoving;
    }

    readZconsFile(currSnapshot_->getTime());

    const std::vector<ZconsData>& fixedZmolData =
        zconsReader_->getFixedZMolData();
    std::vector<ZconsData>::const_iterator j;
    for (j = fixedZmolData.begin(); j != fixedZmolData.end(); ++j) {
      std::map<int, ZConsState>::iterator k = zmolStates_.find(j->zmolIndex);
      assert(k != zmolStates_.end());
      k->second = zsFixed;
    }
  }